

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3StrAccumFinish(StrAccum *p)

{
  int iVar1;
  int iVar2;
  char *__dest;
  
  if (p->zText != (char *)0x0) {
    p->zText[p->nChar] = '\0';
    if ((p->useMalloc != '\0') && (p->zText == p->zBase)) {
      if (p->useMalloc == '\x01') {
        __dest = (char *)sqlite3DbMallocRaw(p->db,p->nChar + 1);
      }
      else {
        iVar1 = p->nChar;
        iVar2 = sqlite3_initialize();
        if (iVar2 == 0) {
          __dest = (char *)sqlite3Malloc(iVar1 + 1);
        }
        else {
          __dest = (char *)0x0;
        }
      }
      p->zText = __dest;
      if (__dest == (char *)0x0) {
        p->mallocFailed = '\x01';
      }
      else {
        memcpy(__dest,p->zBase,(long)p->nChar + 1);
      }
    }
  }
  return p->zText;
}

Assistant:

SQLITE_PRIVATE char *sqlite3StrAccumFinish(StrAccum *p){
  if( p->zText ){
    p->zText[p->nChar] = 0;
    if( p->useMalloc && p->zText==p->zBase ){
      if( p->useMalloc==1 ){
        p->zText = sqlite3DbMallocRaw(p->db, p->nChar+1 );
      }else{
        p->zText = sqlite3_malloc(p->nChar+1);
      }
      if( p->zText ){
        memcpy(p->zText, p->zBase, p->nChar+1);
      }else{
        p->mallocFailed = 1;
      }
    }
  }
  return p->zText;
}